

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp-server.c
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  addrinfo *paVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  FILE *pFVar12;
  byte *pbVar13;
  time_t tVar14;
  uint32_t *puVar15;
  ushort **ppuVar16;
  int *piVar17;
  byte bVar18;
  int iVar19;
  size_t __n;
  char *pcVar20;
  addrinfo **__pai;
  uint uVar21;
  char *pcVar22;
  uint uVar23;
  uint uVar24;
  int processedSize;
  uint local_6a8;
  uint local_6a4;
  char *local_6a0;
  uint local_694;
  long local_690;
  char *local_688;
  char *local_680;
  socklen_t addr_len;
  options_occur_t opt_occurence;
  int local_668;
  int local_664;
  timeval tod;
  ulong local_650;
  addrinfo *servinfo;
  long local_640;
  time_t recvtime;
  server_info_t server_info_storage;
  undefined4 local_598 [12];
  int option_index;
  undefined4 local_564;
  uint local_560;
  undefined4 local_55c;
  undefined4 uStack_558;
  byte local_554 [4];
  ushort local_550 [2];
  ushort local_54c;
  ushort local_54a;
  uint32_t local_548;
  byte abStack_544 [4];
  ushort uStack_540;
  ushort uStack_53e;
  uint32_t auStack_53c [2];
  char local_534 [1052];
  sockaddr_storage their_addr;
  char local_98 [48];
  char s [46];
  
  option_index = 0;
  _opterr = 0;
  local_690 = CONCAT44(local_690._4_4_,0x108102);
  local_6a4 = 0x1081ff;
  local_6a0 = "0.0.0.0";
  local_694 = 0;
  local_668 = 0;
  local_688 = (char *)0x0;
  local_650 = 0;
  local_664 = 0;
  pcVar22 = "5351";
LAB_001013d9:
  do {
    do {
      local_680 = pcVar22;
      iVar4 = getopt_long(argc,argv,"hr:v:p:",main::long_options,&option_index);
      pcVar22 = _optarg;
      if (iVar4 != 0) {
        if (iVar4 == 0x70) {
          uVar5 = atoi(_optarg);
          if (uVar5 - 0x10000 < 0xffff0001) {
            printf("Bad value for option -p %d \n",(ulong)uVar5);
            puts("Port value can be in range 1-65535. ");
            puts("Default value will be used. ");
            pcVar22 = local_680;
          }
          goto LAB_001013d9;
        }
        if (iVar4 == -1) {
          server_info_storage.default_result_code = (uint8_t)local_6a4;
          server_info_storage.end_after_recv = (uint8_t)local_664;
          server_info_storage.server_version = (uint8_t)local_690;
          server_info_storage.tv.tv_sec = local_650 / 1000;
          server_info_storage.tv.tv_usec = (local_650 % 1000) * 1000;
          server_info_storage.epoch_time_start = time((time_t *)0x0);
          pcVar22 = local_688;
          server_info_storage.app_bit = (uint8_t)local_694;
          server_info_storage.ret_dscp = (uint8_t)local_668;
          if (local_688 == (char *)0x0) {
            server_info_storage.log_file[0] = '\0';
          }
          else {
            sVar7 = strlen(local_688);
            __n = 0x40;
            if (sVar7 + 1 < 0x40) {
              __n = sVar7 + 1;
            }
            memcpy(server_info_storage.log_file,pcVar22,__n);
          }
          pcVar20 = local_680;
          pcVar22 = local_6a0;
          printf("Server listening on %s:%s \n",local_6a0,local_680);
          opt_occurence.third_party_occur = 0;
          opt_occurence.pfailure_occur = 0;
          addr_len = 0;
          memset(&option_index,0,0x44c);
          bVar18 = server_info_storage.end_after_recv + (server_info_storage.end_after_recv == '\0')
          ;
          local_598[0] = 1;
          their_addr.__ss_padding[0xe] = '\0';
          their_addr.__ss_padding[0xf] = '\0';
          their_addr.__ss_padding[0x10] = '\0';
          their_addr.__ss_padding[0x11] = '\0';
          their_addr.__ss_padding[0x12] = '\0';
          their_addr.__ss_padding[0x13] = '\0';
          their_addr.__ss_padding[0x14] = '\0';
          their_addr.__ss_padding[0x15] = '\0';
          their_addr.__ss_padding[0x16] = '\0';
          their_addr.__ss_padding[0x17] = '\0';
          their_addr.__ss_padding[0x18] = '\0';
          their_addr.__ss_padding[0x19] = '\0';
          their_addr.__ss_padding[0x1a] = '\0';
          their_addr.__ss_padding[0x1b] = '\0';
          their_addr.__ss_padding[0x1c] = '\0';
          their_addr.__ss_padding[0x1d] = '\0';
          their_addr.__ss_padding[0x1e] = '\0';
          their_addr.__ss_padding[0x1f] = '\0';
          their_addr.__ss_padding[0x20] = '\0';
          their_addr.__ss_padding[0x21] = '\0';
          their_addr.__ss_padding[0x22] = '\0';
          their_addr.__ss_padding[0x23] = '\0';
          their_addr.__ss_padding[0x24] = '\0';
          their_addr.__ss_padding[0x25] = '\0';
          their_addr.__ss_padding[0x26] = '\0';
          their_addr.__ss_padding[0x27] = '\0';
          their_addr.__ss_padding[0x28] = '\0';
          their_addr.__ss_padding[0x29] = '\0';
          their_addr.__ss_padding[0x2a] = '\0';
          their_addr.__ss_padding[0x2b] = '\0';
          their_addr.__ss_padding[0x2c] = '\0';
          their_addr.__ss_padding[0x2d] = '\0';
          their_addr.__ss_padding[6] = '\x02';
          their_addr.__ss_padding[7] = '\0';
          their_addr.__ss_padding[8] = '\0';
          their_addr.__ss_padding[9] = '\0';
          their_addr.__ss_padding[10] = '\0';
          their_addr.__ss_padding[0xb] = '\0';
          their_addr.__ss_padding[0xc] = '\0';
          their_addr.__ss_padding[0xd] = '\0';
          their_addr.ss_family = 1;
          their_addr.__ss_padding[0] = '\0';
          their_addr.__ss_padding[1] = '\0';
          their_addr.__ss_padding[2] = '\0';
          their_addr.__ss_padding[3] = '\0';
          their_addr.__ss_padding[4] = '\0';
          their_addr.__ss_padding[5] = '\0';
          __pai = (addrinfo **)&servinfo;
          iVar4 = getaddrinfo(pcVar22,pcVar20,(addrinfo *)&their_addr,__pai);
          pFVar12 = _stderr;
          if (iVar4 != 0) {
            pcVar22 = gai_strerror(iVar4);
            fprintf(pFVar12,"getaddrinfo: %s\n",pcVar22);
            uVar5 = 1;
            goto LAB_001017c5;
          }
          goto LAB_00101755;
        }
        if (iVar4 == 0x72) {
          local_6a4 = atoi(_optarg);
          uVar5 = local_6a4 & 0xff;
          uVar10 = (ulong)uVar5;
          pcVar22 = local_680;
          if (uVar5 == 0xff || uVar5 < 0xe) goto LAB_001013d9;
          pcVar22 = 
          "Unsupported  RESULT CODE %d (acceptable values 0 <= result_code <= 13 or result_code == 255)\n"
          ;
        }
        else {
          if (iVar4 != 0x76) {
            if (iVar4 == 0x3f) {
              ppuVar16 = __ctype_b_loc();
              pcVar22 = "Unknown option `-%c\'.\n";
              if (((*ppuVar16)[_optopt] >> 0xe & 1) == 0) {
                pcVar22 = "Unknown option character `\\x%x\'.\n";
              }
              fprintf(_stderr,pcVar22);
            }
            goto LAB_00102a5f;
          }
          uVar5 = atoi(_optarg);
          local_690 = CONCAT44(local_690._4_4_,uVar5);
          uVar10 = (ulong)(uVar5 & 0xff);
          pcVar22 = local_680;
          if (0xfffffffd < (uVar5 & 0xff) - 3) goto LAB_001013d9;
          pcVar22 = "Version %d is not supported! \n";
        }
LAB_00102ad7:
        printf(pcVar22,uVar10);
        goto LAB_00102a9d;
      }
      pcVar20 = main::long_options[option_index].name;
      pcVar22 = local_680;
    } while (pcVar20 == (char *)0x0);
    iVar4 = strcmp(pcVar20,"ear");
    pcVar22 = _optarg;
    if (iVar4 == 0) {
      local_664 = atoi(_optarg);
    }
    iVar4 = strcmp(pcVar20,"timeout");
    if (iVar4 == 0) {
      uVar5 = atoi(pcVar22);
      if ((int)uVar5 < 0) {
        pcVar22 = "Value provided for timeout was negative %d. Please provide correct value.\n";
        uVar10 = (ulong)uVar5;
        goto LAB_00102ad7;
      }
      local_650 = (ulong)uVar5;
    }
    iVar4 = strcmp(pcVar20,"app-bit");
    local_694 = local_694 & 0xff;
    if (iVar4 == 0) {
      local_694 = 1;
    }
    iVar4 = strcmp(pcVar20,"ret-dscp");
    if (iVar4 == 0) {
      local_668 = atoi(pcVar22);
    }
    iVar4 = strcmp(pcVar20,"log-file");
    if (iVar4 == 0) {
      local_688 = pcVar22;
    }
    if (((*pcVar20 == 'i') && (pcVar20[1] == 'p')) && (pcVar20[2] == '\0')) {
      local_6a0 = pcVar22;
    }
    iVar4 = strcmp(pcVar20,"ext-ip");
    if (iVar4 == 0) {
      inet_pton(10,pcVar22,&server_info_storage.ext_ip);
      pcVar20 = main::long_options[option_index].name;
    }
    iVar4 = strcmp(pcVar20,"help");
    pcVar22 = local_680;
  } while (iVar4 != 0);
LAB_00102a5f:
  print_usage();
LAB_00102a9d:
  iVar4 = 1;
LAB_00102a9f:
  exit(iVar4);
LAB_00101755:
  paVar2 = *__pai;
  if (paVar2 != (addrinfo *)0x0) {
    uVar5 = socket(paVar2->ai_family,paVar2->ai_socktype,paVar2->ai_protocol);
    pcVar22 = "PCP server: socket";
    if (uVar5 == 0xffffffff) goto LAB_001017b0;
    setsockopt(uVar5,1,2,local_598,4);
    iVar4 = bind(uVar5,paVar2->ai_addr,paVar2->ai_addrlen);
    if (iVar4 == -1) {
      close(uVar5);
      pcVar22 = "PCP server: bind";
      goto LAB_001017b0;
    }
    freeaddrinfo((addrinfo *)servinfo);
LAB_001017c5:
    uVar23 = (uint)bVar18;
    gettimeofday((timeval *)&tod,(__timezone_ptr_t)0x0);
    local_688 = (char *)(server_info_storage.tv.tv_sec + tod.tv_sec);
    pcVar22 = (char *)(server_info_storage.tv.tv_usec + tod.tv_usec);
    local_694 = uVar5;
    while( true ) {
      if (uVar23 == 0) {
        puts("Closing sockfd ");
        close(uVar5);
        return 0;
      }
      uVar23 = (uVar23 - 1) + (uint)(server_info_storage.end_after_recv == '\0');
      recvtime = 0;
      if (server_info_storage.tv.tv_usec != 0 || server_info_storage.tv.tv_sec != 0) {
        gettimeofday((timeval *)&tod,(__timezone_ptr_t)0x0);
        lVar8 = (long)pcVar22 / 1000000;
        pcVar20 = (char *)((long)pcVar22 % 1000000);
        pcVar22 = pcVar20 + 1000000;
        if (-1 < (long)pcVar20) {
          pcVar22 = pcVar20;
        }
        lVar9 = tod.tv_usec / 1000000;
        tod.tv_usec = tod.tv_usec % 1000000;
        tod.tv_sec = lVar9 + tod.tv_sec;
        if (tod.tv_usec < 0) {
          tod.tv_usec = tod.tv_usec + 1000000;
          tod.tv_sec = tod.tv_sec + -1;
        }
        local_688 = local_688 + lVar8 + ((long)pcVar20 >> 0x3f);
        if (((long)local_688 < tod.tv_sec) ||
           (((long)local_688 <= tod.tv_sec && ((long)pcVar22 <= tod.tv_usec)))) {
          servinfo = (addrinfo *)0x0;
          local_640 = 0;
        }
        else {
          if ((long)pcVar22 < tod.tv_usec) {
            uVar10 = (long)((int)tod.tv_usec - (int)pcVar22) / 1000000;
            tod.tv_usec = tod.tv_usec - (ulong)((int)uVar10 * 1000000 + 1000000);
            tod.tv_sec = tod.tv_sec + (uVar10 & 0xffffffff) + 1;
          }
          iVar4 = (int)pcVar22 - (int)tod.tv_usec;
          iVar19 = iVar4 % 1000000;
          servinfo = (addrinfo *)(local_688 + (iVar4 / 1000000 - tod.tv_sec));
          local_640 = (long)iVar19;
          if (iVar19 < 0) {
            local_640 = local_640 + 1000000;
            servinfo = (addrinfo *)((long)&servinfo[-1].ai_next + 7);
          }
        }
        setsockopt(uVar5,1,0x14,&servinfo,0x10);
      }
      puts("###############################################");
      puts("### PCP test server: waiting to recvfrom... ###");
      puts("###############################################");
      addr_len = 0x80;
      uVar10 = recvfrom(uVar5,&option_index,1099,0,(sockaddr *)&their_addr,&addr_len);
      uVar21 = (uint)uVar10;
      if (uVar21 == 0xffffffff) break;
      time(&recvtime);
      pcVar20 = ctime(&recvtime);
      pcVar11 = inet_ntop((uint)their_addr.ss_family,
                          their_addr.__ss_padding + (ulong)(their_addr.ss_family != 2) * 4 + 2,s,
                          0x2e);
      printf("PCP server: got packet at %s from %s\n",pcVar20,pcVar11);
      printf("PCP server: packet is %d bytes long\n",uVar10 & 0xffffffff);
      uVar3 = server_info_storage.server_version;
      local_680 = pcVar22;
      if (uVar21 - 4 < 0x449 && (uVar10 & 3) == 0) {
        if (server_info_storage.log_file[0] == '\0') {
          pFVar12 = (FILE *)0x0;
        }
        else {
          umask(0);
          pFVar12 = fopen(server_info_storage.log_file,"w+");
          if (pFVar12 == (FILE *)0x0) {
            piVar17 = __errno_location();
            pcVar22 = strerror(*piVar17);
            printf("%s:%d \"\": %s \n","printPCPreq",0x1b5,pcVar22);
            goto LAB_00102a9d;
          }
        }
        processedSize = 0;
        local_6a8 = uVar21;
        putchar(10);
        if (pFVar12 == (FILE *)0x0) {
          printf("PCP version:             %i\n",(ulong)(byte)option_index);
        }
        else {
          fputc(10,pFVar12);
          printf("PCP version:             %i\n",(ulong)(byte)option_index);
          fprintf(pFVar12,"PCP version:             %i\n",(ulong)(byte)option_index);
        }
        printf("PCP opcode:              %i\n",(ulong)((uint)option_index >> 8 & 0x7f));
        if (pFVar12 == (FILE *)0x0) {
          printf("PCP R bit:               %i\n",(ulong)(option_index._1_1_ >> 7),
                 (ulong)(option_index._1_1_ >> 7));
        }
        else {
          fprintf(pFVar12,"PCP opcode:              %i\n",(ulong)(option_index._1_1_ & 0x7f));
          printf("PCP R bit:               %i\n",(ulong)(option_index._1_1_ >> 7));
          fprintf(pFVar12,"PCP R bit:               %i\n",(ulong)(option_index._1_1_ >> 7));
        }
        printf("PCP requested lifetime:  %lu\n",
               (ulong)(local_564 >> 0x18 | (local_564 & 0xff0000) >> 8 | (local_564 & 0xff00) << 8 |
                      local_564 << 0x18));
        if (pFVar12 != (FILE *)0x0) {
          fprintf(pFVar12,"PCP requested lifetime:  %lu\n",
                  (ulong)(local_564 >> 0x18 | (local_564 & 0xff0000) >> 8 |
                          (local_564 & 0xff00) << 8 | local_564 << 0x18));
        }
        if (((local_560 == 0) && (local_55c == 0)) && (uStack_558 == -0x10000)) {
          pcVar22 = inet_ntop(2,local_554,local_98,0x2e);
          printf("PEER IP: \t\t %s\n",pcVar22);
          if (pFVar12 == (FILE *)0x0) goto LAB_00101c48;
          pcVar22 = inet_ntop(2,local_554,local_98,0x2e);
LAB_00101c17:
          fprintf(pFVar12,"PEER IP: \t\t %s\n",pcVar22);
          processedSize = 0x18;
          putchar(10);
          fputc(10,pFVar12);
        }
        else {
          pcVar22 = inet_ntop(10,&local_560,local_98,0x2e);
          printf("PEER IP: \t\t %s\n",pcVar22);
          if (pFVar12 != (FILE *)0x0) {
            pcVar22 = inet_ntop(10,&local_560,local_98,0x2e);
            goto LAB_00101c17;
          }
LAB_00101c48:
          processedSize = 0x18;
          putchar(10);
        }
        uVar6 = 1;
        if ((byte)option_index <= uVar3) {
          uVar5 = uVar21 - 0x18;
          if ((option_index & 0xffU) == 2) {
            uVar24 = 0;
            bVar18 = option_index._1_1_;
            if ((option_index._1_1_ & 0x7f) == 1) {
              uVar6 = 6;
              uVar5 = uVar21 - 0x3c;
              local_6a8 = uVar5;
              if (uVar21 < 0x3c) goto LAB_00102889;
              puts("PCP protocol VERSION 2. ");
              if (pFVar12 == (FILE *)0x0) {
                printf("MAP protocol: \t\t %d\n",(ulong)abStack_544[0]);
              }
              else {
                fwrite("PCP protocol VERSION 2. \n",0x19,1,pFVar12);
                printf("MAP protocol: \t\t %d\n",(ulong)abStack_544[0]);
                fprintf(pFVar12,"MAP protocol: \t\t %d\n",(ulong)abStack_544[0]);
              }
              printf("MAP int port: \t\t %d\n",(ulong)(ushort)(uStack_540 << 8 | uStack_540 >> 8));
              if (pFVar12 == (FILE *)0x0) {
                local_6a4 = uVar23;
                printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(uStack_53e << 8 | uStack_53e >> 8))
                ;
              }
              else {
                local_6a4 = uVar23;
                fprintf(pFVar12,"MAP int port: \t\t %d\n",
                        (ulong)(ushort)(uStack_540 << 8 | uStack_540 >> 8));
                printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(uStack_53e << 8 | uStack_53e >> 8))
                ;
                fprintf(pFVar12,"MAP ext port: \t\t %d\n",
                        (ulong)(ushort)(uStack_53e << 8 | uStack_53e >> 8));
              }
              pcVar22 = inet_ntop(10,auStack_53c,(char *)&servinfo,0x2e);
              printf("MAP Ext IP: \t\t %s\n",pcVar22);
              if (pFVar12 != (FILE *)0x0) {
                pcVar22 = inet_ntop(10,auStack_53c,(char *)&servinfo,0x2e);
                fprintf(pFVar12,"MAP Ext IP: \t\t %s\n",pcVar22);
              }
              processedSize = 0x3c;
              uVar24 = 0;
              printf("Remaining size is %d \n",(ulong)uVar5);
              uVar23 = local_6a4;
              while (0 < (int)uVar5) {
                uVar24 = print_PCP_options(&option_index,(int *)&local_6a8,&processedSize,
                                           &opt_occurence,(FILE *)pFVar12);
                uVar5 = local_6a8;
              }
              bVar18 = (byte)((uint)option_index >> 8);
            }
            if ((bVar18 & 0x7f) == 2) {
              local_6a8 = uVar5 - 0x38;
              printf("Remaining size is %d \n");
              uVar6 = 6;
              if ((int)(uVar5 - 0x38) < 0) goto LAB_00102889;
              local_690 = (long)processedSize;
              puts("PCP protocol VERSION 2. ");
              if (pFVar12 == (FILE *)0x0) {
                puts("PEER Opcode specific information. ");
              }
              else {
                fwrite("PCP protocol VERSION 2. \n",0x19,1,pFVar12);
                puts("PEER Opcode specific information. ");
                fwrite("PEER Opcode specific information. \n",0x23,1,pFVar12);
              }
              lVar8 = local_690;
              printf("Protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_55c + local_690));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"Protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_55c + lVar8));
              }
              local_6a4 = uVar23;
              printf("Internal port: \t\t %d\n",
                     (ulong)(ushort)(*(ushort *)((long)&uStack_558 + lVar8) << 8 |
                                    *(ushort *)((long)&uStack_558 + lVar8) >> 8));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"Internal port: \t\t %d\n",
                        (ulong)(ushort)(*(ushort *)((long)&uStack_558 + lVar8) << 8 |
                                       *(ushort *)((long)&uStack_558 + lVar8) >> 8));
              }
              local_6a0 = (char *)((long)local_550 + lVar8 + -4);
              pcVar22 = inet_ntop(10,local_6a0,(char *)&servinfo,0x2e);
              printf("External IP: \t\t %s\n",pcVar22);
              if (pFVar12 != (FILE *)0x0) {
                pcVar22 = inet_ntop(10,local_6a0,(char *)&servinfo,0x2e);
                fprintf(pFVar12,"External IP: \t\t %s\n",pcVar22);
              }
              uVar1 = *(ushort *)((long)&uStack_558 + lVar8 + 2);
              printf("External port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
              if (pFVar12 != (FILE *)0x0) {
                uVar1 = *(ushort *)((long)&uStack_558 + lVar8 + 2);
                fprintf(pFVar12,"External port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8))
                ;
              }
              uVar23 = local_6a4;
              if (((*(int *)((long)&uStack_540 + lVar8) == 0) &&
                  (*(int *)((long)auStack_53c + lVar8) == 0)) &&
                 (*(int *)((long)auStack_53c + lVar8 + 4) == -0x10000)) {
                local_6a0 = local_534 + lVar8;
                pcVar22 = inet_ntop(2,local_6a0,(char *)local_598,0x2e);
                printf("PEER IP: \t\t %s\n",pcVar22);
                if (pFVar12 != (FILE *)0x0) {
                  iVar4 = 2;
LAB_001025b7:
                  pcVar22 = inet_ntop(iVar4,local_6a0,(char *)local_598,0x2e);
                  fprintf(pFVar12,"PEER IP: \t\t %s\n",pcVar22);
                }
              }
              else {
                local_6a0 = (char *)((long)&uStack_540 + lVar8);
                pcVar22 = inet_ntop(10,local_6a0,(char *)local_598,0x2e);
                printf("PEER IP: \t\t %s\n",pcVar22);
                if (pFVar12 != (FILE *)0x0) {
                  iVar4 = 10;
                  goto LAB_001025b7;
                }
              }
              printf("PEER port: \t\t %d\n",
                     (ulong)(ushort)(*(ushort *)(abStack_544 + lVar8) << 8 |
                                    *(ushort *)(abStack_544 + lVar8) >> 8));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"PEER port: \t\t %d\n",
                        (ulong)(ushort)(*(ushort *)(abStack_544 + lVar8) << 8 |
                                       *(ushort *)(abStack_544 + lVar8) >> 8));
              }
              processedSize = (int)local_690 + 0x38;
              uVar5 = uVar5 - 0x38;
              while (0 < (int)uVar5) {
                uVar24 = print_PCP_options(&option_index,(int *)&local_6a8,&processedSize,
                                           &opt_occurence,(FILE *)pFVar12);
                uVar5 = local_6a8;
              }
              bVar18 = (byte)((uint)option_index >> 8);
            }
            if ((bVar18 & 0x7f) == 3) {
              uVar6 = 3;
              if ((int)uVar5 < 0xe) goto LAB_00102889;
              local_690 = (long)processedSize;
              puts("PCP protocol VERSION 2. ");
              if (pFVar12 == (FILE *)0x0) {
                puts("SADSCP Opcode specific information. ");
              }
              else {
                fwrite("PCP protocol VERSION 2. \n",0x19,1,pFVar12);
                puts("SADSCP Opcode specific information. ");
                fwrite("SADSCP Opcode specific information. \n",0x25,1,pFVar12);
              }
              lVar8 = local_690;
              printf("Jitter tolerance:\t %d\n",
                     (ulong)(*(byte *)((long)&local_55c + local_690) >> 2 & 3));
              if (pFVar12 == (FILE *)0x0) {
                bVar18 = *(byte *)((long)&local_55c + lVar8) >> 4 & 3;
                printf("Loss tolerance: \t %d\n",(ulong)bVar18,(ulong)bVar18);
              }
              else {
                fprintf(pFVar12,"Jitter tolerance:\t %d\n",
                        (ulong)(*(byte *)((long)&local_55c + lVar8) >> 2 & 3));
                printf("Loss tolerance: \t %d\n",
                       (ulong)(*(byte *)((long)&local_55c + lVar8) >> 4 & 3));
                fprintf(pFVar12,"Loss tolerance: \t %d\n",
                        (ulong)(*(byte *)((long)&local_55c + lVar8) >> 4 & 3));
              }
              printf("Delay tolerance:  \t %d\n",(ulong)(*(byte *)((long)&local_55c + lVar8) >> 6));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"Delay tolerance:  \t %d\n",
                        (ulong)(*(byte *)((long)&local_55c + lVar8) >> 6));
              }
              printf("App name length: \t %d\n",(ulong)*(byte *)((long)&local_55c + lVar8 + 1));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"App name length: \t %d\n",
                        (ulong)*(byte *)((long)&local_55c + lVar8 + 1));
              }
              local_6a0 = (char *)((long)&local_55c + lVar8 + 2);
              printf("App name:        \t %.*s\n",(ulong)*(byte *)((long)&local_55c + lVar8 + 1));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"App name:        \t %.*s\n",
                        (ulong)*(byte *)((long)&local_55c + lVar8 + 1),local_6a0);
              }
              uVar6 = (uint)*(byte *)((long)&local_55c + lVar8 + 1);
              processedSize = (int)local_690 + uVar6 + 0xe;
              local_6a8 = uVar5 - (uVar6 + 0xe);
              while (0 < (int)local_6a8) {
                uVar24 = print_PCP_options(&option_index,(int *)&local_6a8,&processedSize,
                                           &opt_occurence,(FILE *)pFVar12);
              }
            }
          }
          else {
            if ((option_index & 0xffU) != 1) goto LAB_00102889;
            uVar24 = 0;
            if ((option_index._1_1_ & 0x7f) == 1) {
              uVar5 = uVar21 - 0x30;
              uVar6 = 6;
              local_6a8 = uVar5;
              if (uVar21 < 0x30) goto LAB_00102889;
              puts("PCP protocol VERSION 1. ");
              if (pFVar12 == (FILE *)0x0) {
                printf("MAP protocol: \t\t %d\n",(ulong)(byte)local_550[0]);
              }
              else {
                fwrite("PCP protocol VERSION 1. \n",0x19,1,pFVar12);
                printf("MAP protocol: \t\t %d\n",(ulong)(byte)local_550[0]);
                fprintf(pFVar12,"MAP protocol: \t\t %d\n",(ulong)(byte)local_550[0]);
              }
              printf("MAP int port: \t\t %d\n",(ulong)(ushort)(local_54c << 8 | local_54c >> 8));
              if (pFVar12 == (FILE *)0x0) {
                local_6a4 = uVar23;
                printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(local_54a << 8 | local_54a >> 8));
              }
              else {
                local_6a4 = uVar23;
                fprintf(pFVar12,"MAP int port: \t\t %d\n",
                        (ulong)(ushort)(local_54c << 8 | local_54c >> 8));
                printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(local_54a << 8 | local_54a >> 8));
                fprintf(pFVar12,"MAP ext port: \t\t %d\n",
                        (ulong)(ushort)(local_54a << 8 | local_54a >> 8));
              }
              pcVar22 = inet_ntop(10,&local_548,(char *)&servinfo,0x2e);
              printf("MAP Ext IP: \t\t %s\n",pcVar22);
              if (pFVar12 != (FILE *)0x0) {
                pcVar22 = inet_ntop(10,&local_548,(char *)&servinfo,0x2e);
                fprintf(pFVar12,"MAP Ext IP: \t\t %s\n",pcVar22);
              }
              processedSize = 0x30;
              uVar24 = 0;
              printf("Remaining size is %d \n",(ulong)uVar5);
              uVar23 = local_6a4;
              while (0 < (int)uVar5) {
                uVar24 = print_PCP_options(&option_index,(int *)&local_6a8,&processedSize,
                                           &opt_occurence,(FILE *)pFVar12);
                uVar5 = local_6a8;
              }
            }
            if ((option_index._1_1_ & 0x7f) == 2) {
              local_6a8 = uVar5 - 0x18;
              printf("Remaining size is %d \n");
              uVar6 = 6;
              if ((int)(uVar5 - 0x18) < 0) goto LAB_00102889;
              local_690 = (long)processedSize;
              puts("PCP protocol VERSION 1. ");
              if (pFVar12 == (FILE *)0x0) {
                puts("PEER Opcode specific information. ");
              }
              else {
                fwrite("PCP protocol VERSION 1. \n",0x19,1,pFVar12);
                puts("PEER Opcode specific information. ");
                fwrite("PEER Opcode specific information. \n",0x23,1,pFVar12);
              }
              lVar8 = local_690;
              pbVar13 = (byte *)((long)&option_index + local_690);
              printf("Protocol: \t\t %d\n",(ulong)*pbVar13);
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"Protocol: \t\t %d\n",(ulong)*pbVar13);
              }
              local_6a4 = uVar23;
              printf("Internal port: \t\t %d\n",
                     (ulong)(ushort)(*(ushort *)((long)&local_564 + lVar8) << 8 |
                                    *(ushort *)((long)&local_564 + lVar8) >> 8));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"Internal port: \t\t %d\n",
                        (ulong)(ushort)(*(ushort *)((long)&local_564 + lVar8) << 8 |
                                       *(ushort *)((long)&local_564 + lVar8) >> 8));
              }
              local_6a0 = (char *)((long)&local_560 + lVar8);
              pcVar22 = inet_ntop(10,local_6a0,(char *)&servinfo,0x2e);
              printf("External IP: \t\t %s\n",pcVar22);
              if (pFVar12 != (FILE *)0x0) {
                pcVar22 = inet_ntop(10,local_6a0,(char *)&servinfo,0x2e);
                fprintf(pFVar12,"External IP: \t\t %s\n",pcVar22);
              }
              uVar1 = *(ushort *)((long)&local_564 + lVar8 + 2);
              printf("External port port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
              if (pFVar12 != (FILE *)0x0) {
                uVar1 = *(ushort *)((long)&local_564 + lVar8 + 2);
                fprintf(pFVar12,"External port port: \t\t %d\n",
                        (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
              }
              local_6a0 = (char *)((long)&local_54c + lVar8);
              pcVar22 = inet_ntop(10,local_6a0,(char *)local_598,0x2e);
              printf("PEER IP: \t\t %s\n",pcVar22);
              if (pFVar12 != (FILE *)0x0) {
                pcVar22 = inet_ntop(10,local_6a0,(char *)local_598,0x2e);
                fprintf(pFVar12,"PEER IP: \t\t %s\n",pcVar22);
              }
              printf("PEER port port: \t\t %d\n",
                     (ulong)(ushort)(*(ushort *)((long)local_550 + lVar8) << 8 |
                                    *(ushort *)((long)local_550 + lVar8) >> 8));
              if (pFVar12 != (FILE *)0x0) {
                fprintf(pFVar12,"PEER port port: \t\t %d\n",
                        (ulong)(ushort)(*(ushort *)((long)local_550 + lVar8) << 8 |
                                       *(ushort *)((long)local_550 + lVar8) >> 8));
              }
              uVar23 = local_6a4;
              processedSize = (int)local_690 + 0x2c;
              uVar5 = uVar5 - 0x18;
              while (0 < (int)uVar5) {
                uVar24 = print_PCP_options(&option_index,(int *)&local_6a8,&processedSize,
                                           &opt_occurence,(FILE *)pFVar12);
                uVar5 = local_6a8;
              }
            }
          }
          fflush(pFVar12);
          uVar6 = uVar24;
        }
      }
      else {
        puts(
            "Size of PCP packet is either smaller than 4 octets or larger than 1100 bytes or the size is not multiple of 4."
            );
        printf("The size was: %d \n",uVar10 & 0xffffffff);
        uVar6 = 3;
      }
LAB_00102889:
      if (server_info_storage.default_result_code != 0xff) {
        uVar6 = (uint)server_info_storage.default_result_code;
      }
      _local_55c = 0;
      local_554[0] = 0;
      local_554[1] = 0;
      local_554[2] = 0;
      local_554[3] = 0;
      uVar1 = (ushort)option_index;
      option_index._0_3_ = (uint3)(uVar1 | 0x8000);
      option_index = CONCAT13((char)uVar6,(uint3)option_index);
      tVar14 = time((time_t *)0x0);
      pcVar22 = local_680;
      uVar5 = local_694;
      uVar24 = (int)tVar14 - (int)server_info_storage.epoch_time_start;
      local_560 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                  uVar24 * 0x1000000;
      if (uVar6 == 1) {
        option_index = CONCAT31(option_index._1_3_,server_info_storage.server_version);
      }
      else if ((option_index._1_1_ & 0x7f) == 3) {
        abStack_544[0] = server_info_storage.app_bit << 7 | server_info_storage.ret_dscp;
      }
      else if ((option_index._1_1_ & 0x7f) == 1) {
        if ((option_index & 0xffU) == 2) {
          puVar15 = auStack_53c;
        }
        else {
          if ((option_index & 0xffU) != 1) goto LAB_00102989;
          puVar15 = &local_548;
        }
        *puVar15 = server_info_storage.ext_ip.__in6_u.__u6_addr32[0];
        puVar15[1] = server_info_storage.ext_ip.__in6_u.__u6_addr32[1];
        puVar15[2] = server_info_storage.ext_ip.__in6_u.__u6_addr32[2];
        puVar15[3] = server_info_storage.ext_ip.__in6_u.__u6_addr32[3];
      }
LAB_00102989:
      sendto(local_694,&option_index,(long)(int)uVar21,0,(sockaddr *)&their_addr,addr_len);
      opt_occurence.third_party_occur = 0;
      opt_occurence.pfailure_occur = 0;
      putchar(10);
    }
    perror("recvfrom");
    goto LAB_00102a9d;
  }
  goto LAB_00102aa5;
LAB_001017b0:
  perror(pcVar22);
  __pai = &paVar2->ai_next;
  goto LAB_00101755;
LAB_00102aa5:
  fwrite("PCP server: failed to bind socket\n",0x22,1,_stderr);
  iVar4 = 2;
  goto LAB_00102a9f;
}

Assistant:

int main(int argc, char *argv[]) {

    const char *port = PCP_PORT;
    int test_port;
    uint8_t pcp_version = PCP_TEST_MAX_VERSION;
    uint8_t end_after_recv = 0;
    uint8_t default_result_code = 255;
#ifdef WIN32
    long timeout_us = 0;
#else
    suseconds_t timeout_us = 0;
#endif
    server_info_t server_info_storage;
    const char *server_ip = "0.0.0.0";
    uint8_t app_bit = 0;
    uint8_t ret_dscp = 0;
    char *log_file = NULL;

    {
        int c;
        int option_index = 0;

        static struct option long_options[] = {
            {"ear", required_argument, 0, 0},
            {"help", no_argument, 0, 0},
            {"ip", required_argument, 0, 0},
            {"ext-ip", required_argument, 0, 0},
            {"timeout", required_argument, 0, 0},
            {"app-bit", no_argument, 0, 0},
            {"ret-dscp", required_argument, 0, 0},
            {"log-file", required_argument, 0, 0},
            {0, 0, 0, 0}};

        opterr = 0;
        while ((c = getopt_long(argc, argv, "hr:v:p:", long_options,
                                &option_index)) != -1) {
            switch (c) {
            // assign values for long options
            case 0:
                if (!long_options[option_index].name) {
                    break;
                }

                if (!strcmp(long_options[option_index].name, "ear"))
                    end_after_recv = (uint8_t)atoi(optarg);

                if (!strcmp(long_options[option_index].name, "timeout")) {
                    int temp_timeout = atoi(optarg);
                    if (temp_timeout < 0) {
                        printf("Value provided for timeout was negative %d. "
                               "Please provide correct value.\n",
                               temp_timeout);
                        exit(1);
                    } else {
#ifdef WIN32
                        timeout_us = (long)atoi(optarg);
#else
                        timeout_us = (suseconds_t)atoi(optarg);
#endif
                    }
                }

                if (!strcmp(long_options[option_index].name, "app-bit")) {
                    app_bit = 1;
                }

                if (!strcmp(long_options[option_index].name, "ret-dscp")) {
                    ret_dscp = (uint8_t)atoi(optarg);
                }

                if (!strcmp(long_options[option_index].name, "log-file")) {
                    log_file = optarg;
                }

                if (!strcmp(long_options[option_index].name, "ip"))
                    server_ip = optarg;

                if (!strcmp(long_options[option_index].name, "ext-ip")) {
                    inet_pton(AF_INET6, optarg, &server_info_storage.ext_ip);
                }

                if (!strcmp(long_options[option_index].name, "help")) {
                    print_usage();
                    exit(1);
                }

                break;
            case 'h':
                print_usage();
                exit(1);
                break;
            case 'p':
                test_port = atoi(optarg);
                if ((test_port < 1) || (test_port > 65535)) {
                    printf("Bad value for option -p %d \n", test_port);
                    printf("Port value can be in range 1-65535. \n");
                    printf("Default value will be used. \n");
                } else {
                    port = optarg;
                }
                break;
            case 'r':
                default_result_code = (uint8_t)atoi(optarg);
                if (default_result_code > 13 && default_result_code != 255) {
                    printf("Unsupported  RESULT CODE %d (acceptable values "
                           "0 <= result_code <= 13 or result_code == 255)\n",
                           default_result_code);
                    exit(1);
                }
                break;
            case 'v':
                pcp_version = (uint8_t)atoi(optarg);
                if (pcp_version < 1 || pcp_version > 2) {
                    printf("Version %d is not supported! \n", pcp_version);
                    exit(1);
                }
                break;
            case '?':
                if (isprint(optopt))
                    fprintf(stderr, "Unknown option `-%c'.\n", optopt);
                else
                    fprintf(stderr, "Unknown option character `\\x%x'.\n",
                            optopt);
                print_usage();
                exit(1);
            default: // LCOV_EXCL_START
                print_usage();
                exit(1);
                break; // LCOV_EXCL_STOP
            }
        }
    }

    server_info_storage.default_result_code = default_result_code;
    server_info_storage.end_after_recv = end_after_recv;
    server_info_storage.server_version = pcp_version;
    server_info_storage.tv.tv_sec = timeout_us / 1000;
    server_info_storage.tv.tv_usec = (timeout_us % 1000) * 1000;
    server_info_storage.epoch_time_start = time(NULL);
    server_info_storage.app_bit = app_bit;
    server_info_storage.ret_dscp = ret_dscp;
    if (log_file != NULL) {
        memcpy(&(server_info_storage.log_file[0]), log_file,
               min(strlen(log_file) + 1, MAX_LOG_FILE));
    } else {
        server_info_storage.log_file[0] = 0;
    }

    printf("Server listening on %s:%s \n", server_ip, port);
    return execPCPServer(port, server_ip, &server_info_storage);
}